

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

int Ifd_ManDsdTest4(void)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int t;
  int Entry;
  int i;
  Vec_Int_t *vGuide;
  int pPerm [6];
  
  vGuide = (Vec_Int_t *)0x100000000;
  pPerm[0] = 2;
  pPerm[1] = 3;
  pPerm[2] = 4;
  pPerm[3] = 5;
  p = Ifd_ManDsdPermJT(6);
  for (t = 0; iVar1 = Vec_IntSize(p), t < iVar1; t = t + 1) {
    iVar2 = Vec_IntEntry(p,t);
    iVar1 = pPerm[(long)iVar2 + -2];
    pPerm[(long)iVar2 + -2] = pPerm[(long)(iVar2 + 1) + -2];
    pPerm[(long)(iVar2 + 1) + -2] = iVar1;
    Ifd_ManDsdPermPrint((int *)&vGuide,6);
  }
  Vec_IntFree(p);
  return 1;
}

Assistant:

int Ifd_ManDsdTest4() 
{
    int pPerm[6] = { 0, 1, 2, 3, 4, 5 };
    Vec_Int_t * vGuide = Ifd_ManDsdPermJT( 6 );
    int i, Entry;
    Vec_IntForEachEntry( vGuide, Entry, i )
    {
        ABC_SWAP( int, pPerm[Entry], pPerm[Entry+1] );
        Ifd_ManDsdPermPrint( pPerm, 6 );
    }
    Vec_IntFree( vGuide );
    return 1;
}